

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::QuantizationParams::QuantizationParams
          (QuantizationParams *this,QuantizationParams *from)

{
  void *pvVar1;
  LookUpTableQuantizationParams *this_00;
  LookUpTableQuantizationParams *from_00;
  LinearQuantizationParams *this_01;
  LinearQuantizationParams *from_01;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__QuantizationParams_00395c08;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  this->numberofbits_ = from->numberofbits_;
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 0x65) {
    this_01 = mutable_linearquantization(this);
    from_01 = linearquantization(from);
    LinearQuantizationParams::MergeFrom(this_01,from_01);
  }
  else if (from->_oneof_case_[0] == 0x66) {
    this_00 = mutable_lookuptablequantization(this);
    from_00 = lookuptablequantization(from);
    LookUpTableQuantizationParams::MergeFrom(this_00,from_00);
  }
  return;
}

Assistant:

QuantizationParams::QuantizationParams(const QuantizationParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  numberofbits_ = from.numberofbits_;
  clear_has_QuantizationType();
  switch (from.QuantizationType_case()) {
    case kLinearQuantization: {
      mutable_linearquantization()->::CoreML::Specification::LinearQuantizationParams::MergeFrom(from.linearquantization());
      break;
    }
    case kLookupTableQuantization: {
      mutable_lookuptablequantization()->::CoreML::Specification::LookUpTableQuantizationParams::MergeFrom(from.lookuptablequantization());
      break;
    }
    case QUANTIZATIONTYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.QuantizationParams)
}